

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
  *pFVar3;
  FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
  *pFVar4;
  value_type vVar5;
  value_type vVar6;
  value_type vVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  bool bVar11;
  double *pdVar12;
  uint uVar13;
  ulong uVar14;
  double local_48;
  
  pFVar3 = (fadexpr->fadexpr_).left_;
  pFVar4 = (fadexpr->fadexpr_).right_;
  uVar1 = ((Vector<double> *)
          ((long)&(((((pFVar3->fadexpr_).left_)->fadexpr_).expr_)->fadexpr_).expr_ + 8))->num_elts;
  uVar2 = (((pFVar3->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts;
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = (((pFVar4->fadexpr_).left_)->fadexpr_).expr_.dx_.num_elts;
  uVar13 = (((pFVar4->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts;
  if ((int)uVar13 < (int)uVar1) {
    uVar13 = uVar1;
  }
  if ((int)uVar13 < (int)uVar2) {
    uVar13 = uVar2;
  }
  uVar1 = (this->dx_).num_elts;
  if (uVar13 == uVar1) {
    if (uVar13 == 0) goto LAB_01423b7d;
    pdVar12 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar13 == 0) {
      if (uVar1 != 0) {
        pdVar12 = (this->dx_).ptr_to_data;
        if (pdVar12 != (double *)0x0) {
          operator_delete__(pdVar12);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_01423b7d;
    }
    if (uVar1 != 0) {
      pdVar12 = (this->dx_).ptr_to_data;
      if (pdVar12 != (double *)0x0) {
        operator_delete__(pdVar12);
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar13;
    uVar14 = 0xffffffffffffffff;
    if (-1 < (int)uVar13) {
      uVar14 = (ulong)uVar13 << 3;
    }
    pdVar12 = (double *)operator_new__(uVar14);
    (this->dx_).ptr_to_data = pdVar12;
  }
  bVar11 = FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>
           ::hasFastAccess(&fadexpr->fadexpr_);
  if (bVar11) {
    if (0 < (int)uVar13) {
      uVar14 = 0;
      do {
        vVar5 = FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>
                ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar14);
        pdVar12[uVar14] = vVar5;
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
  }
  else if (0 < (int)uVar13) {
    uVar14 = 0;
    do {
      vVar6 = FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
              ::dx(&((fadexpr->fadexpr_).left_)->fadexpr_,(int)uVar14);
      vVar7 = FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>
              ::dx(&((fadexpr->fadexpr_).right_)->fadexpr_,(int)uVar14);
      pdVar12[uVar14] = vVar6 - vVar7;
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
  }
LAB_01423b7d:
  pFVar3 = (fadexpr->fadexpr_).left_;
  local_48 = cos((((((pFVar3->fadexpr_).left_)->fadexpr_).expr_)->fadexpr_).expr_.val_);
  local_48 = -local_48;
  dVar8 = cos((((pFVar3->fadexpr_).right_)->fadexpr_).expr_.val_);
  pFVar4 = (fadexpr->fadexpr_).right_;
  dVar9 = sin((((pFVar4->fadexpr_).left_)->fadexpr_).expr_.val_);
  dVar10 = sin((((pFVar4->fadexpr_).right_)->fadexpr_).expr_.val_);
  this->val_ = dVar8 * local_48 - dVar10 * dVar9;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}